

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_helper.c
# Opt level: O0

void helper_v7m_bxns_arm(CPUARMState *env,uint32_t dest)

{
  int iVar1;
  uint local_18;
  uint32_t min_magic;
  uint32_t dest_local;
  CPUARMState *env_local;
  
  iVar1 = arm_feature(env,0x25);
  if (iVar1 == 0) {
    local_18 = 0xff000000;
  }
  else {
    local_18 = 0xfefffffe;
  }
  if (local_18 <= dest) {
    env->regs[0xf] = dest & 0xfffffffe;
    env->thumb = dest & 1;
    helper_exception_internal_arm(env,8);
  }
  if ((env->v7m).secure != 0) {
    if ((dest & 1) == 0) {
      (env->v7m).control[1] = (env->v7m).control[1] & 0xfffffff7;
    }
    switch_v7m_security_state(env,(dest & 1) != 0);
    env->thumb = 1;
    env->regs[0xf] = dest & 0xfffffffe;
    arm_rebuild_hflags_arm(env);
    return;
  }
  __assert_fail("env->v7m.secure",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/m_helper.c"
                ,0x1cb,"void helper_v7m_bxns_arm(CPUARMState *, uint32_t)");
}

Assistant:

void HELPER(v7m_bxns)(CPUARMState *env, uint32_t dest)
{
    /*
     * Handle v7M BXNS:
     *  - if the return value is a magic value, do exception return (like BX)
     *  - otherwise bit 0 of the return value is the target security state
     */
    uint32_t min_magic;

    if (arm_feature(env, ARM_FEATURE_M_SECURITY)) {
        /* Covers FNC_RETURN and EXC_RETURN magic */
        min_magic = FNC_RETURN_MIN_MAGIC;
    } else {
        /* EXC_RETURN magic only */
        min_magic = EXC_RETURN_MIN_MAGIC;
    }

    if (dest >= min_magic) {
        /*
         * This is an exception return magic value; put it where
         * do_v7m_exception_exit() expects and raise EXCEPTION_EXIT.
         * Note that if we ever add gen_ss_advance() singlestep support to
         * M profile this should count as an "instruction execution complete"
         * event (compare gen_bx_excret_final_code()).
         */
        env->regs[15] = dest & ~1;
        env->thumb = dest & 1;
        HELPER(exception_internal)(env, EXCP_EXCEPTION_EXIT);
        /* notreached */
    }

    /* translate.c should have made BXNS UNDEF unless we're secure */
    assert(env->v7m.secure);

    if (!(dest & 1)) {
        env->v7m.control[M_REG_S] &= ~R_V7M_CONTROL_SFPA_MASK;
    }
    switch_v7m_security_state(env, dest & 1);
    env->thumb = 1;
    env->regs[15] = dest & ~1;
    arm_rebuild_hflags(env);
}